

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O1

int Sbd_ManCollectConstants
              (sat_solver *pSat,int *nCareMints,int PivotVar,word **pVarSims,Vec_Int_t *vInds)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  long lVar9;
  int iLit;
  uint local_58;
  uint local_54;
  undefined8 local_50;
  uint local_44;
  Vec_Int_t *local_40;
  int *local_38;
  
  local_50 = CONCAT44(in_register_00000014,PivotVar);
  local_38 = nCareMints;
  if (vInds->nSize != nCareMints[1] + *nCareMints) {
    __assert_fail("Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                  ,0x19f,
                  "int Sbd_ManCollectConstants(sat_solver *, int *, int, word **, Vec_Int_t *)");
  }
  if (0 < vInds->nSize) {
    local_44 = PivotVar * 2;
    lVar9 = 0;
    local_40 = vInds;
    do {
      iVar6 = *local_38;
      if ((int)local_50 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      iVar1 = local_40->pArray[lVar9];
      local_54 = local_44 | lVar9 < iVar6;
      sat_solver_random_polarity(pSat);
      iVar5 = sat_solver_solve(pSat,(lit *)&local_54,(lit *)&local_50,0,0,0,0);
      if (iVar5 == -1) {
        bVar4 = false;
        local_58 = (uint)(lVar9 < iVar6);
      }
      else if (iVar5 == 0) {
        local_58 = 0xfffffffe;
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if (-1 < (int)local_50) {
          iVar6 = iVar1 >> 6;
          bVar7 = (byte)iVar1 & 0x3f;
          uVar3 = pSat->size;
          if (pSat->size < 1) {
            uVar3 = 0;
          }
          uVar8 = 0;
          do {
            if (uVar3 == uVar8) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            uVar2 = pVarSims[uVar8][iVar6];
            if (((pSat->model[uVar8] != 1 ^ (byte)(uVar2 >> bVar7)) & 1) == 0) {
              pVarSims[uVar8][iVar6] = uVar2 ^ 1L << bVar7;
            }
            uVar8 = uVar8 + 1;
          } while (PivotVar + 1 != uVar8);
        }
      }
      if (!bVar4) {
        return local_58;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < local_40->nSize);
  }
  return -1;
}

Assistant:

int Sbd_ManCollectConstants( sat_solver * pSat, int nCareMints[2], int PivotVar, word * pVarSims[], Vec_Int_t * vInds )
{
    int nBTLimit = 0;
    int i, Ind; 
    assert( Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1] );
    Vec_IntForEachEntry( vInds, Ind, i )
    {
        int fOffSet = (int)(i < nCareMints[0]);
        int status, k, iLit = Abc_Var2Lit( PivotVar, fOffSet );
        sat_solver_random_polarity( pSat );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return fOffSet;
        for ( k = 0; k <= PivotVar; k++ )
            if ( Abc_TtGetBit(pVarSims[k], Ind) != sat_solver_var_value(pSat, k) )
                Abc_TtXorBit(pVarSims[k], Ind);
    }
    return -1;
}